

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  PmDeviceInfo *pPVar6;
  char *pcVar7;
  int iVar8;
  uint id;
  
  puts("Apparently this is a 64-bit machine.");
  if (argc < 2) {
    show_usage();
    bVar2 = false;
    bVar1 = false;
  }
  else {
    bVar1 = false;
    bVar2 = false;
    bVar3 = false;
    iVar5 = 1;
    while( true ) {
      if (argc <= iVar5) break;
      pcVar7 = argv[iVar5];
      if ((*pcVar7 == '-') && ((pcVar7[1] != 'h' || (pcVar7[2] != '\0')))) {
        if ((pcVar7[1] == 'l') && (pcVar7[2] == '\0')) {
          iVar8 = iVar5 + 1;
          if (argc <= iVar8) goto LAB_00102924;
          latency = atoi(argv[iVar8]);
          printf("Latency will be %ld\n",(long)latency);
          bVar3 = true;
        }
        else {
LAB_00102924:
          if ((pcVar7[1] == 'r') && (pcVar7[2] == '\0')) {
            iVar8 = iVar5 + 1;
            msgrate = atoi(argv[(long)iVar5 + 1]);
            printf("Rate will be %d messages/second\n",(ulong)(uint)msgrate);
            bVar1 = true;
          }
          else if ((pcVar7[1] == 's') && (pcVar7[2] == '\0')) {
            iVar8 = iVar5 + 1;
            duration = atoi(argv[(long)iVar5 + 1]);
            printf("Duration will be %d seconds\n",(ulong)(uint)msgrate);
            bVar2 = true;
          }
          else {
            if ((pcVar7[1] != 'n') || (pcVar7[2] != '\0')) goto LAB_00102948;
            puts("Sending expired timestamps (-n)");
            expired_timestamps = 1;
            iVar8 = iVar5;
          }
        }
      }
      else {
LAB_00102948:
        show_usage();
        iVar8 = iVar5;
      }
      iVar5 = iVar8 + 1;
    }
    if (bVar3) goto LAB_001029dc;
  }
  latency = get_number("Latency in ms: ");
LAB_001029dc:
  if (!bVar1) {
    msgrate = get_number("Rate in messages per second: ");
  }
  if (!bVar2) {
    duration = get_number("Duration in seconds: ");
  }
  Pm_GetDefaultInputDeviceID();
  uVar4 = Pm_GetDefaultOutputDeviceID();
  id = 0;
  while( true ) {
    iVar5 = Pm_CountDevices();
    if (iVar5 <= (int)id) break;
    pPVar6 = Pm_GetDeviceInfo(id);
    if (pPVar6->output != 0) {
      printf("%d: %s, %s",(ulong)id,pPVar6->interf,pPVar6->name);
      pcVar7 = "";
      if (uVar4 == id) {
        pcVar7 = "default ";
      }
      if (id == deviceno) {
        pcVar7 = "selected ";
      }
      printf(" (%soutput)",pcVar7);
      putchar(10);
    }
    id = id + 1;
  }
  deviceno = get_number("Output device number: ");
  fast_test();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int default_in;
    int default_out;
    int i = 0;
    int latency_valid = FALSE;
    int rate_valid = FALSE;
    int device_valid = FALSE;
    int dur_valid = FALSE;
    
    if (sizeof(void *) == 8) 
        printf("Apparently this is a 64-bit machine.\n");
    else if (sizeof(void *) == 4) 
        printf ("Apparently this is a 32-bit machine.\n");
    
    if (argc <= 1) {
        show_usage();
    } else {
        for (i = 1; i < argc; i++) {
            if (strcmp(argv[i], "-h") == 0) {
                show_usage();
            } else if (strcmp(argv[i], "-l") == 0 && (i + 1 < argc)) {
                i = i + 1;
                latency = atoi(argv[i]);
                printf("Latency will be %ld\n", (long) latency);
                latency_valid = TRUE;
            } else if (strcmp(argv[i], "-r") == 0) {
                i = i + 1;
                msgrate = atoi(argv[i]);
                printf("Rate will be %d messages/second\n", msgrate);
                rate_valid = TRUE;
            } else if (strcmp(argv[i], "-s") == 0) {
                i = i + 1;
                duration = atoi(argv[i]);
                printf("Duration will be %d seconds\n", msgrate);
                dur_valid = TRUE;
            } else if (strcmp(argv[i], "-n") == 0) {
                printf("Sending expired timestamps (-n)\n");
                expired_timestamps = TRUE;
            } else {
                show_usage();
            }
        }
    }

    if (!latency_valid) {
        // coerce to known size
        latency = (int32_t) get_number("Latency in ms: "); 
    }

    if (!rate_valid) {
        // coerce from "%d" to known size
        msgrate = (int32_t) get_number("Rate in messages per second: ");
    }

    if (!dur_valid) {
        duration = get_number("Duration in seconds: ");
    }

    /* list device information */
    default_in = Pm_GetDefaultInputDeviceID();
    default_out = Pm_GetDefaultOutputDeviceID();
    for (i = 0; i < Pm_CountDevices(); i++) {
        char *deflt;
        const PmDeviceInfo *info = Pm_GetDeviceInfo(i);
        if (info->output) {
            printf("%d: %s, %s", i, info->interf, info->name);
            deflt = (i == deviceno ? "selected " :
                      (i == default_out ? "default " : ""));
            printf(" (%soutput)", deflt);
            printf("\n");
        }
    }
    
    if (!device_valid) {
        deviceno = get_number("Output device number: ");
    }

    fast_test();
    return 0;
}